

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::DepthStencilTests::init(DepthStencilTests *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppDVar1;
  allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams> *this_00;
  Context *pCVar2;
  bool bVar3;
  deUint32 dVar4;
  int a;
  deUint32 dVar5;
  TestNode *pTVar6;
  ostream *poVar7;
  DepthStencilCase *pDVar8;
  char *pcVar9;
  ulong extraout_RAX;
  CommandLine *this_01;
  reference params_00;
  ulong uVar10;
  deUint32 local_680;
  deUint32 local_67c;
  string local_640;
  __normal_iterator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams_*,_std::vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>_>
  local_620;
  __normal_iterator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams_*,_std::vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>_>
  local_618;
  iterator iter;
  Random rnd;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  subCases;
  int caseNdx;
  TestCaseGroup *randomGroup;
  undefined1 local_5c8 [4];
  int ndx_3;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  cases_4;
  DepthStencilParams params_4;
  int ndx_2;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  cases_3;
  DepthStencilParams params_3;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  cases_2;
  DepthStencilParams params_2;
  TestCaseGroup *writeMaskGroup;
  string local_478 [36];
  uint local_454;
  FaceType local_450;
  FaceType notVisible_1;
  FaceType visible_1;
  int ndx_1;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  cases_1;
  ostringstream name_1;
  DepthStencilParams params_1;
  int dPass;
  int dFail;
  int sFail;
  TestCaseGroup *opCombinationGroup;
  string local_248 [36];
  uint local_224;
  FaceType local_220;
  FaceType notVisible;
  FaceType visible;
  int ndx;
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  cases;
  undefined1 local_1f8 [6];
  bool hasDepthFunc;
  bool hasStencilFunc;
  ostringstream name;
  DepthStencilParams params;
  int depthFunc;
  int stencilFunc;
  TestCaseGroup *functionsGroup;
  DepthStencilTests *this_local;
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "stencil_depth_funcs","Combinations of Depth and Stencil Functions");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  params.depthWriteMask = false;
  params._77_3_ = 0;
  for (; (int)params._76_4_ < 9; params._76_4_ = params._76_4_ + 1) {
    for (params.depth = 0.0; (int)params.depth < 9; params.depth = (float)((int)params.depth + 1)) {
      DepthStencilCaseUtil::DepthStencilParams::DepthStencilParams
                ((DepthStencilParams *)&name.field_0x174);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      cases.
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
           de::inBounds<int>(params._76_4_,0,8);
      cases.
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ =
           de::inBounds<int>((int)params.depth,0,8);
      if ((cases.
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        std::operator<<((ostream *)local_1f8,"no_stencil_");
      }
      else {
        poVar7 = std::operator<<((ostream *)local_1f8,"stencil_");
        poVar7 = std::operator<<(poVar7,init::compareFuncs[(int)params._76_4_].name);
        std::operator<<(poVar7,"_");
      }
      if ((cases.
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
        std::operator<<((ostream *)local_1f8,"no_depth");
      }
      else {
        poVar7 = std::operator<<((ostream *)local_1f8,"depth_");
        std::operator<<(poVar7,init::compareFuncs[(int)params.depth].name);
      }
      if ((cases.
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
        local_67c = 0;
      }
      else {
        local_67c = init::compareFuncs[(int)params.depth].func;
      }
      params.stencil[1].writeMask = local_67c;
      params.stencil[1].depthPassOp._0_1_ =
           cases.
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1;
      params.depthFunc._0_1_ = 1;
      std::
      vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
      ::vector((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                *)&visible);
      for (notVisible = FACETYPE_FRONT; (int)notVisible < 4; notVisible = notVisible + FACETYPE_BACK
          ) {
        local_220 = init::functionCases[(int)notVisible].visibleFace;
        local_224 = (uint)(local_220 == FACETYPE_FRONT);
        params._64_4_ = init::functionCases[(int)notVisible].depth;
        if ((cases.
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
          local_680 = 0;
        }
        else {
          local_680 = init::compareFuncs[(int)params._76_4_].func;
        }
        params.stencil[(ulong)local_220 - 1].depthPassOp = local_680;
        params.stencil[(ulong)local_220 - 1].writeMask =
             init::functionCases[(int)notVisible].stencilRef;
        params.stencil[local_220].reference = init::functionCases[(int)notVisible].sFail;
        params.stencil[local_220].compareMask = init::functionCases[(int)notVisible].dFail;
        params.stencil[local_220].stencilFailOp = init::functionCases[(int)notVisible].dPass;
        params.stencil[local_220].function = init::functionCases[(int)notVisible].compareMask;
        params.stencil[local_220].depthFailOp = init::functionCases[(int)notVisible].writeMask;
        params.stencil[(ulong)local_224 - 1].depthPassOp = 0x207;
        params.stencil[(ulong)local_224 - 1].writeMask = 0;
        params.stencil[local_224].reference = 0x1e01;
        params.stencil[local_224].compareMask = 0x1e01;
        params.stencil[local_224].stencilFailOp = 0x1e01;
        params.stencil[local_224].function = 0;
        params.stencil[local_224].depthFailOp = 0xffffffff;
        name._372_4_ = local_220;
        std::
        vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
        ::push_back((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                     *)&visible,(value_type *)&name.field_0x174);
      }
      pDVar8 = (DepthStencilCase *)operator_new(0x148);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::ostringstream::str();
      pcVar9 = (char *)std::__cxx11::string::c_str();
      DepthStencilCase::DepthStencilCase
                (pDVar8,pCVar2,pcVar9,"",
                 (vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                  *)&visible);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pDVar8);
      std::__cxx11::string::~string(local_248);
      std::
      vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
      ::~vector((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                 *)&visible);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
    }
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"stencil_ops",
             "Stencil Op Combinations");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  for (dPass = 0; dPass < 8; dPass = dPass + 1) {
    params_1.depthWriteMask = false;
    params_1._77_3_ = 0;
    for (; (int)params_1._76_4_ < 8; params_1._76_4_ = params_1._76_4_ + 1) {
      for (params_1.depth = 0.0; (int)params_1.depth < 8;
          params_1.depth = (float)((int)params_1.depth + 1)) {
        DepthStencilCaseUtil::DepthStencilParams::DepthStencilParams
                  ((DepthStencilParams *)&name_1.field_0x174);
        ppDVar1 = &cases_1.
                   super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppDVar1);
        poVar7 = std::operator<<((ostream *)ppDVar1,init::stencilOps[dPass].name);
        poVar7 = std::operator<<(poVar7,"_");
        poVar7 = std::operator<<(poVar7,init::stencilOps[(int)params_1._76_4_].name);
        poVar7 = std::operator<<(poVar7,"_");
        std::operator<<(poVar7,init::stencilOps[(int)params_1.depth].name);
        params_1.stencil[1].writeMask = 0x203;
        params_1.depthTestEnabled = false;
        params_1._65_3_ = 0;
        params_1.stencil[1].depthPassOp._0_1_ = 1;
        params_1.depthFunc._0_1_ = 1;
        std::
        vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
        ::vector((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                  *)&visible_1);
        for (notVisible_1 = FACETYPE_FRONT; (int)notVisible_1 < 4;
            notVisible_1 = notVisible_1 + FACETYPE_BACK) {
          local_450 = init::opCombinationCases[(int)notVisible_1].visibleFace;
          local_454 = (uint)(local_450 == FACETYPE_FRONT);
          params_1.stencil[(ulong)local_450 - 1].depthPassOp =
               init::opCombinationCases[(int)notVisible_1].func;
          params_1.stencil[(ulong)local_450 - 1].writeMask =
               init::opCombinationCases[(int)notVisible_1].ref;
          params_1.stencil[local_450].reference = init::stencilOps[dPass].op;
          params_1.stencil[local_450].compareMask = init::stencilOps[(int)params_1._76_4_].op;
          params_1.stencil[local_450].stencilFailOp = init::stencilOps[(int)params_1.depth].op;
          params_1.stencil[local_450].function =
               init::opCombinationCases[(int)notVisible_1].compareMask;
          params_1.stencil[local_450].depthFailOp =
               init::opCombinationCases[(int)notVisible_1].writeMask;
          params_1.stencil[(ulong)local_454 - 1].depthPassOp = 0x207;
          params_1.stencil[(ulong)local_454 - 1].writeMask = 0;
          params_1.stencil[local_454].reference = 0x1e01;
          params_1.stencil[local_454].compareMask = 0x1e01;
          params_1.stencil[local_454].stencilFailOp = 0x1e01;
          params_1.stencil[local_454].function = 0;
          params_1.stencil[local_454].depthFailOp = 0xffffffff;
          name_1._372_4_ = local_450;
          std::
          vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
          ::push_back((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                       *)&visible_1,(value_type *)&name_1.field_0x174);
        }
        pDVar8 = (DepthStencilCase *)operator_new(0x148);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        DepthStencilCase::DepthStencilCase
                  (pDVar8,pCVar2,pcVar9,"",
                   (vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                    *)&visible_1);
        tcu::TestNode::addChild(pTVar6,(TestNode *)pDVar8);
        std::__cxx11::string::~string(local_478);
        std::
        vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
        ::~vector((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                   *)&visible_1);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)
                   &cases_1.
                    super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"write_mask",
             "Depth and Stencil Write Masks");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  ppDVar1 = &cases_2.
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  DepthStencilCaseUtil::DepthStencilParams::DepthStencilParams((DepthStencilParams *)ppDVar1);
  cases_2.
  super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::vector((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
            *)&params_3.depth);
  cases_2.
  super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::push_back((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
               *)&params_3.depth,(value_type *)ppDVar1);
  cases_2.
  super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::push_back((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
               *)&params_3.depth,
              (value_type *)
              &cases_2.
               super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cases_2.
  super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::push_back((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
               *)&params_3.depth,
              (value_type *)
              &cases_2.
               super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cases_2.
  super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::push_back((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
               *)&params_3.depth,
              (value_type *)
              &cases_2.
               super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pDVar8 = (DepthStencilCase *)operator_new(0x148);
  DepthStencilCase::DepthStencilCase
            (pDVar8,(this->super_TestCaseGroup).m_context,"depth","Depth Write Mask",
             (vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
              *)&params_3.depth);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pDVar8);
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::~vector((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
             *)&params_3.depth);
  DepthStencilCaseUtil::DepthStencilParams::DepthStencilParams
            ((DepthStencilParams *)
             &cases_3.
              super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  params_3.stencil[1].writeMask = 0x203;
  params_3.depthTestEnabled = false;
  params_3._65_3_ = 0;
  params_3.stencil[1].depthPassOp._0_1_ = 1;
  params_3.depthFunc._0_1_ = 1;
  cases_3.
  super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
  params_3.visibleFace = 0x205;
  params_3.stencilTestEnabled = true;
  params_3._5_3_ = 0;
  params_3.stencil[0].reference = 0x150a;
  params_3.stencil[0].compareMask = 0x1e02;
  params_3.stencil[0].stencilFailOp = 0x1e03;
  params_3.stencil[0].function = 0xffffffff;
  params_3.stencil[0].depthPassOp = 0x207;
  params_3.stencil[0].writeMask = 0;
  params_3.stencil[1].reference = 0x1e01;
  params_3.stencil[1].compareMask = 0x150a;
  params_3.stencil[1].stencilFailOp = 0x1e02;
  params_3.stencil[1].function = 0xffffffff;
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::vector((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
            *)&params_4.depthWriteMask);
  for (params_4.depth = 0.0; (int)params_4.depth < 8;
      params_4.depth = (float)((int)params_4.depth + 1)) {
    cases_3.
    super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         init::stencilWmaskCases[(int)params_4.depth].visibleFace;
    params_3.stencil[0].depthFailOp = init::stencilWmaskCases[(int)params_4.depth].frontWriteMask;
    params_3.stencil[1].depthFailOp = init::stencilWmaskCases[(int)params_4.depth].backWriteMask;
    std::
    vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
    ::push_back((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                 *)&params_4.depthWriteMask,
                (value_type *)
                &cases_3.
                 super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  pDVar8 = (DepthStencilCase *)operator_new(0x148);
  DepthStencilCase::DepthStencilCase
            (pDVar8,(this->super_TestCaseGroup).m_context,"stencil","Stencil Write Mask",
             (vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
              *)&params_4.depthWriteMask);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pDVar8);
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::~vector((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
             *)&params_4.depthWriteMask);
  DepthStencilCaseUtil::DepthStencilParams::DepthStencilParams
            ((DepthStencilParams *)
             ((long)&cases_4.
                     super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  params_4.stencil[1].writeMask = 0x203;
  params_4.depthTestEnabled = false;
  params_4._65_3_ = 0;
  params_4.stencil[1].depthPassOp._0_1_ = 1;
  params_4.depthFunc._0_1_ = 1;
  params_4.visibleFace = 0x205;
  params_4.stencilTestEnabled = true;
  params_4._5_3_ = 0;
  params_4.stencil[0].reference = 0x150a;
  params_4.stencil[0].compareMask = 0x1e02;
  params_4.stencil[0].stencilFailOp = 0x1e03;
  params_4.stencil[0].function = 0xffffffff;
  params_4.stencil[0].depthPassOp = 0x207;
  params_4.stencil[0].writeMask = 0;
  params_4.stencil[1].reference = 0x1e01;
  params_4.stencil[1].compareMask = 0x150a;
  params_4.stencil[1].stencilFailOp = 0x1e02;
  params_4.stencil[1].function = 0xffffffff;
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::vector((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
            *)local_5c8);
  for (randomGroup._4_4_ = 0; randomGroup._4_4_ < 0xc; randomGroup._4_4_ = randomGroup._4_4_ + 1) {
    params_4.depthFunc._0_1_ = init::depthStencilWmaskCases[randomGroup._4_4_].depthWriteMask & 1;
    cases_4.
    super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         init::depthStencilWmaskCases[randomGroup._4_4_].visibleFace;
    params_4.stencil[0].depthFailOp = init::depthStencilWmaskCases[randomGroup._4_4_].frontWriteMask
    ;
    params_4.stencil[1].depthFailOp = init::depthStencilWmaskCases[randomGroup._4_4_].backWriteMask;
    std::
    vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
    ::push_back((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                 *)local_5c8,
                (value_type *)
                ((long)&cases_4.
                        super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  }
  pDVar8 = (DepthStencilCase *)operator_new(0x148);
  DepthStencilCase::DepthStencilCase
            (pDVar8,(this->super_TestCaseGroup).m_context,"both","Depth and Stencil Write Masks",
             (vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
              *)local_5c8);
  tcu::TestNode::addChild(pTVar6,(TestNode *)pDVar8);
  std::
  vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ::~vector((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
             *)local_5c8);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Randomized Depth and Stencil Test Cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  subCases.
  super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  uVar10 = extraout_RAX;
  while ((int)subCases.
              super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 0x19) {
    this_00 = (allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams> *)
              ((long)&rnd.m_rnd.z + 3);
    std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>::allocator
              (this_00);
    std::
    vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
    ::vector((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
              *)&rnd.m_rnd.w,10,this_00);
    std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>::~allocator
              ((allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams> *)
               ((long)&rnd.m_rnd.z + 3));
    dVar4 = ::deInt32Hash(subCases.
                          super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    this_01 = tcu::TestContext::getCommandLine
                        ((this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx);
    a = tcu::CommandLine::getBaseSeed(this_01);
    dVar5 = ::deInt32Hash(a);
    de::Random::Random((Random *)((long)&iter._M_current + 4),dVar4 ^ dVar5);
    local_618._M_current =
         (DepthStencilParams *)
         std::
         vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
         ::begin((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                  *)&rnd.m_rnd.w);
    while( true ) {
      local_620._M_current =
           (DepthStencilParams *)
           std::
           vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ::end((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                  *)&rnd.m_rnd.w);
      bVar3 = __gnu_cxx::operator!=(&local_618,&local_620);
      if (!bVar3) break;
      params_00 = __gnu_cxx::
                  __normal_iterator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams_*,_std::vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>_>
                  ::operator*(&local_618);
      randomDepthStencilState((Random *)((long)&iter._M_current + 4),params_00);
      __gnu_cxx::
      __normal_iterator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams_*,_std::vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>_>
      ::operator++(&local_618);
    }
    pDVar8 = (DepthStencilCase *)operator_new(0x148);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    de::toString<int>(&local_640,
                      (int *)((long)&subCases.
                                     super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    pcVar9 = (char *)std::__cxx11::string::c_str();
    DepthStencilCase::DepthStencilCase
              (pDVar8,pCVar2,pcVar9,"",
               (vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                *)&rnd.m_rnd.w);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pDVar8);
    std::__cxx11::string::~string((string *)&local_640);
    de::Random::~Random((Random *)((long)&iter._M_current + 4));
    std::
    vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
    ::~vector((vector<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
               *)&rnd.m_rnd.w);
    subCases.
    super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         subCases.
         super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    uVar10 = (ulong)subCases.
                    super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return (int)uVar10;
}

Assistant:

void DepthStencilTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	func;
	} compareFuncs[] =
	{
		{ "never",		GL_NEVER	},
		{ "always",		GL_ALWAYS	},
		{ "less",		GL_LESS		},
		{ "lequal",		GL_LEQUAL	},
		{ "equal",		GL_EQUAL	},
		{ "gequal",		GL_GEQUAL	},
		{ "greater",	GL_GREATER	},
		{ "notequal",	GL_NOTEQUAL	}
	};

	static const struct
	{
		const char*	name;
		deUint32	op;
	} stencilOps[] =
	{
		{ "keep",		GL_KEEP			},
		{ "zero",		GL_ZERO			},
		{ "replace",	GL_REPLACE		},
		{ "incr",		GL_INCR			},
		{ "decr",		GL_DECR			},
		{ "invert",		GL_INVERT		},
		{ "incr_wrap",	GL_INCR_WRAP	},
		{ "decr_wrap",	GL_DECR_WRAP	}
	};

	static const struct
	{
		rr::FaceType	visibleFace;
		deUint32		sFail;
		deUint32		dFail;
		deUint32		dPass;
		int				stencilRef;
		deUint32		compareMask;
		deUint32		writeMask;
		float			depth;
	} functionCases[] =
	{
		{ rr::FACETYPE_BACK,	GL_DECR,		GL_INCR,	GL_INVERT,		4,	~0u, ~0u,	-0.7f },
		{ rr::FACETYPE_FRONT,	GL_DECR,		GL_INCR,	GL_INVERT,		2,	~0u, ~0u,	0.0f },
		{ rr::FACETYPE_BACK,	GL_DECR,		GL_INCR,	GL_INVERT,		1,	~0u, ~0u,	0.2f },
		{ rr::FACETYPE_FRONT,	GL_DECR_WRAP,	GL_INVERT,	GL_REPLACE,		4,	~0u, ~0u,	1.0f }
	};

	// All combinations of depth stencil functions.
	{
		tcu::TestCaseGroup* functionsGroup = new tcu::TestCaseGroup(m_testCtx, "stencil_depth_funcs", "Combinations of Depth and Stencil Functions");
		addChild(functionsGroup);

		for (int stencilFunc = 0; stencilFunc < DE_LENGTH_OF_ARRAY(compareFuncs)+1; stencilFunc++)
		{
			// One extra: depth test disabled.
			for (int depthFunc = 0; depthFunc < DE_LENGTH_OF_ARRAY(compareFuncs)+1; depthFunc++)
			{
				DepthStencilParams	params;
				ostringstream		name;
				bool				hasStencilFunc	= de::inBounds(stencilFunc, 0, DE_LENGTH_OF_ARRAY(compareFuncs));
				bool				hasDepthFunc	= de::inBounds(depthFunc, 0, DE_LENGTH_OF_ARRAY(compareFuncs));

				if (hasStencilFunc)
					name << "stencil_" << compareFuncs[stencilFunc].name << "_";
				else
					name << "no_stencil_";

				if (hasDepthFunc)
					name << "depth_" << compareFuncs[depthFunc].name;
				else
					name << "no_depth";

				params.depthFunc			= hasDepthFunc ? compareFuncs[depthFunc].func : 0;
				params.depthTestEnabled		= hasDepthFunc;
				params.depthWriteMask		= true;

				params.stencilTestEnabled	= hasStencilFunc;

				vector<DepthStencilParams> cases;
				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(functionCases); ndx++)
				{
					rr::FaceType	visible		= functionCases[ndx].visibleFace;
					rr::FaceType	notVisible	= visible == rr::FACETYPE_FRONT ? rr::FACETYPE_BACK : rr::FACETYPE_FRONT;

					params.depth								= functionCases[ndx].depth;
					params.visibleFace							= visible;

					params.stencil[visible].function			= hasStencilFunc ? compareFuncs[stencilFunc].func : 0;
					params.stencil[visible].reference			= functionCases[ndx].stencilRef;
					params.stencil[visible].stencilFailOp		= functionCases[ndx].sFail;
					params.stencil[visible].depthFailOp			= functionCases[ndx].dFail;
					params.stencil[visible].depthPassOp			= functionCases[ndx].dPass;
					params.stencil[visible].compareMask			= functionCases[ndx].compareMask;
					params.stencil[visible].writeMask			= functionCases[ndx].writeMask;

					params.stencil[notVisible].function			= GL_ALWAYS;
					params.stencil[notVisible].reference		= 0;
					params.stencil[notVisible].stencilFailOp	= GL_REPLACE;
					params.stencil[notVisible].depthFailOp		= GL_REPLACE;
					params.stencil[notVisible].depthPassOp		= GL_REPLACE;
					params.stencil[notVisible].compareMask		= 0u;
					params.stencil[notVisible].writeMask		= ~0u;


					cases.push_back(params);
				}

				functionsGroup->addChild(new DepthStencilCase(m_context, name.str().c_str(), "", cases));
			}
		}
	}

	static const struct
	{
		rr::FaceType	visibleFace;
		deUint32		func;
		int				ref;
		deUint32		compareMask;
		deUint32		writeMask;
	} opCombinationCases[] =
	{
		{ rr::FACETYPE_BACK,	GL_LESS,		4,		~0u,	~0u	},
		{ rr::FACETYPE_FRONT,	GL_GREATER,		2,		~0u,	~0u	},
		{ rr::FACETYPE_BACK,	GL_EQUAL,		3,		~2u,	~0u	},
		{ rr::FACETYPE_FRONT,	GL_NOTEQUAL,	1,		~0u,	~1u	}
	};

	// All combinations of stencil ops.
	{
		tcu::TestCaseGroup* opCombinationGroup = new tcu::TestCaseGroup(m_testCtx, "stencil_ops", "Stencil Op Combinations");
		addChild(opCombinationGroup);

		for (int sFail = 0; sFail < DE_LENGTH_OF_ARRAY(stencilOps); sFail++)
		{
			for (int dFail = 0; dFail < DE_LENGTH_OF_ARRAY(stencilOps); dFail++)
			{
				for (int dPass = 0; dPass < DE_LENGTH_OF_ARRAY(stencilOps); dPass++)
				{
					DepthStencilParams	params;
					ostringstream		name;

					name << stencilOps[sFail].name << "_" << stencilOps[dFail].name << "_" << stencilOps[dPass].name;

					params.depthFunc			= GL_LEQUAL;
					params.depth				= 0.0f;
					params.depthTestEnabled		= true;
					params.depthWriteMask		= true;

					params.stencilTestEnabled	= true;

					vector<DepthStencilParams> cases;
					for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(opCombinationCases); ndx++)
					{
						rr::FaceType	visible		= opCombinationCases[ndx].visibleFace;
						rr::FaceType	notVisible	= visible == rr::FACETYPE_FRONT ? rr::FACETYPE_BACK : rr::FACETYPE_FRONT;

						params.visibleFace							= visible;

						params.stencil[visible].function			= opCombinationCases[ndx].func;
						params.stencil[visible].reference			= opCombinationCases[ndx].ref;
						params.stencil[visible].stencilFailOp		= stencilOps[sFail].op;
						params.stencil[visible].depthFailOp			= stencilOps[dFail].op;
						params.stencil[visible].depthPassOp			= stencilOps[dPass].op;
						params.stencil[visible].compareMask			= opCombinationCases[ndx].compareMask;
						params.stencil[visible].writeMask			= opCombinationCases[ndx].writeMask;

						params.stencil[notVisible].function			= GL_ALWAYS;
						params.stencil[notVisible].reference		= 0;
						params.stencil[notVisible].stencilFailOp	= GL_REPLACE;
						params.stencil[notVisible].depthFailOp		= GL_REPLACE;
						params.stencil[notVisible].depthPassOp		= GL_REPLACE;
						params.stencil[notVisible].compareMask		= 0u;
						params.stencil[notVisible].writeMask		= ~0u;


						cases.push_back(params);
					}

					opCombinationGroup->addChild(new DepthStencilCase(m_context, name.str().c_str(), "", cases));
				}
			}
		}
	}

	// Write masks
	{
		tcu::TestCaseGroup* writeMaskGroup = new tcu::TestCaseGroup(m_testCtx, "write_mask", "Depth and Stencil Write Masks");
		addChild(writeMaskGroup);

		// Depth mask
		{
			DepthStencilParams params;

			params.depthFunc			= GL_LEQUAL;
			params.depth				= 0.0f;
			params.depthTestEnabled		= true;
			params.stencilTestEnabled	= true;

			params.stencil[rr::FACETYPE_FRONT].function			= GL_NOTEQUAL;
			params.stencil[rr::FACETYPE_FRONT].reference		= 1;
			params.stencil[rr::FACETYPE_FRONT].stencilFailOp	= GL_INVERT;
			params.stencil[rr::FACETYPE_FRONT].depthFailOp		= GL_INCR;
			params.stencil[rr::FACETYPE_FRONT].depthPassOp		= GL_DECR;
			params.stencil[rr::FACETYPE_FRONT].compareMask		= ~0u;
			params.stencil[rr::FACETYPE_FRONT].writeMask		= ~0u;

			params.stencil[rr::FACETYPE_BACK].function			= GL_ALWAYS;
			params.stencil[rr::FACETYPE_BACK].reference			= 0;
			params.stencil[rr::FACETYPE_BACK].stencilFailOp		= GL_REPLACE;
			params.stencil[rr::FACETYPE_BACK].depthFailOp		= GL_INVERT;
			params.stencil[rr::FACETYPE_BACK].depthPassOp		= GL_INCR;
			params.stencil[rr::FACETYPE_BACK].compareMask		= ~0u;
			params.stencil[rr::FACETYPE_BACK].writeMask			= ~0u;

			vector<DepthStencilParams> cases;

			// Case 1: front, depth write enabled
			params.visibleFace		= rr::FACETYPE_FRONT;
			params.depthWriteMask	= true;
			cases.push_back(params);

			// Case 2: front, depth write disabled
			params.visibleFace		= rr::FACETYPE_FRONT;
			params.depthWriteMask	= false;
			cases.push_back(params);

			// Case 3: back, depth write enabled
			params.visibleFace		= rr::FACETYPE_BACK;
			params.depthWriteMask	= true;
			cases.push_back(params);

			// Case 4: back, depth write disabled
			params.visibleFace		= rr::FACETYPE_BACK;
			params.depthWriteMask	= false;
			cases.push_back(params);

			writeMaskGroup->addChild(new DepthStencilCase(m_context, "depth", "Depth Write Mask", cases));
		}

		// Stencil write masks.
		{
			static const struct
			{
				rr::FaceType	visibleFace;
				deUint32		frontWriteMask;
				deUint32		backWriteMask;
			} stencilWmaskCases[] =
			{
				{ rr::FACETYPE_FRONT,	~0u,	0u		},
				{ rr::FACETYPE_FRONT,	0u,		~0u		},
				{ rr::FACETYPE_FRONT,	0xfu,	0xf0u	},
				{ rr::FACETYPE_FRONT,	0x2u,	0x4u	},
				{ rr::FACETYPE_BACK,	0u,		~0u		},
				{ rr::FACETYPE_BACK,	~0u,	0u		},
				{ rr::FACETYPE_BACK,	0xf0u,	0xfu	},
				{ rr::FACETYPE_BACK,	0x4u,	0x2u	}
			};

			DepthStencilParams params;

			params.depthFunc			= GL_LEQUAL;
			params.depth				= 0.0f;
			params.depthTestEnabled		= true;
			params.depthWriteMask		= true;
			params.stencilTestEnabled	= true;

			params.stencil[rr::FACETYPE_FRONT].function			= GL_NOTEQUAL;
			params.stencil[rr::FACETYPE_FRONT].reference		= 1;
			params.stencil[rr::FACETYPE_FRONT].stencilFailOp	= GL_INVERT;
			params.stencil[rr::FACETYPE_FRONT].depthFailOp		= GL_INCR;
			params.stencil[rr::FACETYPE_FRONT].depthPassOp		= GL_DECR;
			params.stencil[rr::FACETYPE_FRONT].compareMask		= ~0u;

			params.stencil[rr::FACETYPE_BACK].function			= GL_ALWAYS;
			params.stencil[rr::FACETYPE_BACK].reference			= 0;
			params.stencil[rr::FACETYPE_BACK].stencilFailOp		= GL_REPLACE;
			params.stencil[rr::FACETYPE_BACK].depthFailOp		= GL_INVERT;
			params.stencil[rr::FACETYPE_BACK].depthPassOp		= GL_INCR;
			params.stencil[rr::FACETYPE_BACK].compareMask		= ~0u;

			vector<DepthStencilParams> cases;
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(stencilWmaskCases); ndx++)
			{
				params.visibleFace								= stencilWmaskCases[ndx].visibleFace;
				params.stencil[rr::FACETYPE_FRONT].writeMask	= stencilWmaskCases[ndx].frontWriteMask;
				params.stencil[rr::FACETYPE_BACK].writeMask		= stencilWmaskCases[ndx].backWriteMask;
				cases.push_back(params);
			}

			writeMaskGroup->addChild(new DepthStencilCase(m_context, "stencil", "Stencil Write Mask", cases));
		}

		// Depth & stencil write masks.
		{
			static const struct
			{
				bool			depthWriteMask;
				rr::FaceType	visibleFace;
				deUint32		frontWriteMask;
				deUint32		backWriteMask;
			} depthStencilWmaskCases[] =
			{
				{ false,	rr::FACETYPE_FRONT,		~0u,	0u		},
				{ false,	rr::FACETYPE_FRONT,		0u,		~0u		},
				{ false,	rr::FACETYPE_FRONT,		0xfu,	0xf0u	},
				{ true,		rr::FACETYPE_FRONT,		~0u,	0u		},
				{ true,		rr::FACETYPE_FRONT,		0u,		~0u		},
				{ true,		rr::FACETYPE_FRONT,		0xfu,	0xf0u	},
				{ false,	rr::FACETYPE_BACK,		0u,		~0u		},
				{ false,	rr::FACETYPE_BACK,		~0u,	0u		},
				{ false,	rr::FACETYPE_BACK,		0xf0u,	0xfu	},
				{ true,		rr::FACETYPE_BACK,		0u,		~0u		},
				{ true,		rr::FACETYPE_BACK,		~0u,	0u		},
				{ true,		rr::FACETYPE_BACK,		0xf0u,	0xfu	}
			};

			DepthStencilParams params;

			params.depthFunc			= GL_LEQUAL;
			params.depth				= 0.0f;
			params.depthTestEnabled		= true;
			params.depthWriteMask		= true;
			params.stencilTestEnabled	= true;

			params.stencil[rr::FACETYPE_FRONT].function			= GL_NOTEQUAL;
			params.stencil[rr::FACETYPE_FRONT].reference		= 1;
			params.stencil[rr::FACETYPE_FRONT].stencilFailOp	= GL_INVERT;
			params.stencil[rr::FACETYPE_FRONT].depthFailOp		= GL_INCR;
			params.stencil[rr::FACETYPE_FRONT].depthPassOp		= GL_DECR;
			params.stencil[rr::FACETYPE_FRONT].compareMask		= ~0u;

			params.stencil[rr::FACETYPE_BACK].function			= GL_ALWAYS;
			params.stencil[rr::FACETYPE_BACK].reference			= 0;
			params.stencil[rr::FACETYPE_BACK].stencilFailOp		= GL_REPLACE;
			params.stencil[rr::FACETYPE_BACK].depthFailOp		= GL_INVERT;
			params.stencil[rr::FACETYPE_BACK].depthPassOp		= GL_INCR;
			params.stencil[rr::FACETYPE_BACK].compareMask		= ~0u;

			vector<DepthStencilParams> cases;
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthStencilWmaskCases); ndx++)
			{
				params.depthWriteMask							= depthStencilWmaskCases[ndx].depthWriteMask;
				params.visibleFace								= depthStencilWmaskCases[ndx].visibleFace;
				params.stencil[rr::FACETYPE_FRONT].writeMask	= depthStencilWmaskCases[ndx].frontWriteMask;
				params.stencil[rr::FACETYPE_BACK].writeMask		= depthStencilWmaskCases[ndx].backWriteMask;
				cases.push_back(params);
			}

			writeMaskGroup->addChild(new DepthStencilCase(m_context, "both", "Depth and Stencil Write Masks", cases));
		}
	}

	// Randomized cases
	{
		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Randomized Depth and Stencil Test Cases");
		addChild(randomGroup);

		for (int caseNdx = 0; caseNdx < NUM_RANDOM_CASES; caseNdx++)
		{
			vector<DepthStencilParams>	subCases	(NUM_RANDOM_SUB_CASES);
			de::Random					rnd			(deInt32Hash(caseNdx) ^ deInt32Hash(m_testCtx.getCommandLine().getBaseSeed()));

			for (vector<DepthStencilParams>::iterator iter = subCases.begin(); iter != subCases.end(); ++iter)
				randomDepthStencilState(rnd, *iter);

			randomGroup->addChild(new DepthStencilCase(m_context, de::toString(caseNdx).c_str(), "", subCases));
		}
	}
}